

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamStandardIndex::GetOffset
          (BamStandardIndex *this,BamRegion *region,int64_t *offset,bool *hasAlignmentsInRegion)

{
  int64_t *position;
  pointer plVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  reference refSummary;
  BamException *pBVar5;
  int64_t *piVar6;
  difference_type __d;
  ulong uVar7;
  size_type __n;
  BamStandardIndex *this_00;
  ulong uVar8;
  int64_t *piVar9;
  allocator local_265;
  uint32_t begin;
  BamRegion *local_260;
  vector<long,_std::allocator<long>_> offsets;
  uint32_t end;
  set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> candidateBins;
  string message;
  string readerError;
  uint64_t local_1b0;
  string local_1a8;
  BamAlignment al;
  
  __n = (size_type)region->LeftRefID;
  piVar6 = offset;
  local_260 = region;
  if ((-1 < (long)__n) &&
     (lVar4 = (long)(this->m_indexFileSummary).
                    super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_indexFileSummary).
                    super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
                    ._M_impl.super__Vector_impl_data._M_start, piVar6 = (int64_t *)(lVar4 % 0x18),
     region->LeftRefID < (int)(lVar4 / 0x18))) {
    refSummary = std::
                 vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
                 ::at(&this->m_indexFileSummary,__n);
    this_00 = this;
    AdjustRegion(this,local_260,&begin,&end);
    candidateBins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &candidateBins._M_t._M_impl.super__Rb_tree_header._M_header;
    candidateBins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    candidateBins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    candidateBins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    candidateBins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         candidateBins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    CalculateCandidateBins(this_00,&begin,&end,&candidateBins);
    local_1b0 = CalculateMinOffset(this,refSummary,&begin);
    offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    CalculateCandidateOffsets(this,refSummary,&local_1b0,&candidateBins,&offsets);
    if (offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      std::
      __sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ();
      BamAlignment::BamAlignment(&al);
      uVar8 = (long)offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      piVar6 = offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      plVar1 = offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      while (piVar9 = plVar1, 0 < (long)uVar8) {
        uVar7 = uVar8 >> 1;
        position = piVar9 + uVar7;
        bVar2 = BamReaderPrivate::Seek((this->super_BamIndex).m_reader,position);
        if (!bVar2) {
          BamReaderPrivate::GetErrorString_abi_cxx11_(&readerError,(this->super_BamIndex).m_reader);
          std::operator+(&message,"could not seek in BAM file: \n\t",&readerError);
          pBVar5 = (BamException *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string((string *)&local_1a8,"BamToolsIndex::GetOffset",&local_265);
          BamException::BamException(pBVar5,&local_1a8,&message);
          __cxa_throw(pBVar5,&BamException::typeinfo,BamException::~BamException);
        }
        bVar2 = BamReaderPrivate::LoadNextAlignment((this->super_BamIndex).m_reader,&al);
        *hasAlignmentsInRegion = bVar2;
        iVar3 = BamAlignment::GetEndPosition(&al,false,false);
        piVar6 = position + 1;
        uVar8 = uVar8 + ~uVar7;
        plVar1 = piVar6;
        if (local_260->LeftPosition < iVar3) {
          uVar8 = uVar7;
          piVar6 = position;
          plVar1 = piVar9;
        }
      }
      *offset = piVar6[(ulong)(piVar6 ==
                              offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start) - 1];
      BamAlignment::~BamAlignment(&al);
    }
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&offsets.super__Vector_base<long,_std::allocator<long>_>);
    std::
    _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
    ::~_Rb_tree(&candidateBins._M_t);
    return;
  }
  pBVar5 = (BamException *)__cxa_allocate_exception(0x28,__n,piVar6);
  std::__cxx11::string::string
            ((string *)&al,"BamStandardIndex::GetOffset",(allocator *)&readerError);
  std::__cxx11::string::string
            ((string *)&candidateBins,"invalid reference ID requested",(allocator *)&message);
  BamException::BamException(pBVar5,&al.Name,(string *)&candidateBins);
  __cxa_throw(pBVar5,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::GetOffset(const BamRegion& region, int64_t& offset, bool* hasAlignmentsInRegion) {

    // cannot calculate offsets if unknown/invalid reference ID requested
    if ( region.LeftRefID < 0 || region.LeftRefID >= (int)m_indexFileSummary.size() )
        throw BamException("BamStandardIndex::GetOffset", "invalid reference ID requested");

    // retrieve index summary for left bound reference
    const BaiReferenceSummary& refSummary = m_indexFileSummary.at(region.LeftRefID);

    // set up region boundaries based on actual BamReader data
    uint32_t begin;
    uint32_t end;
    AdjustRegion(region, begin, end);

    // retrieve all candidate bin IDs for region
    set<uint16_t> candidateBins;
    CalculateCandidateBins(begin, end, candidateBins);

    // use reference's linear offsets to calculate the minimum offset
    // that must be considered to find overlap
    const uint64_t& minOffset = CalculateMinOffset(refSummary, begin);

    // attempt to use reference summary, minOffset, & candidateBins to calculate offsets
    // no data should not be error, just bail
    vector<int64_t> offsets;
    CalculateCandidateOffsets(refSummary, minOffset, candidateBins, offsets);
    if ( offsets.empty() )
        return;
    
    // ensure that offsets are sorted before processing
    sort( offsets.begin(), offsets.end() );

    // binary search for an overlapping block (may not be first one though)
    BamAlignment al;
    typedef vector<int64_t>::const_iterator OffsetConstIterator;
    OffsetConstIterator offsetFirst = offsets.begin();
    OffsetConstIterator offsetIter  = offsetFirst;
    OffsetConstIterator offsetLast  = offsets.end();
    iterator_traits<OffsetConstIterator>::difference_type count = distance(offsetFirst, offsetLast);
    iterator_traits<OffsetConstIterator>::difference_type step;
    while ( count > 0 ) {
        offsetIter = offsetFirst;
        step = count/2;
        advance(offsetIter, step);

        // attempt seek to candidate offset
        const int64_t& candidateOffset = (*offsetIter);
        if ( !m_reader->Seek(candidateOffset) ) {
            const string readerError = m_reader->GetErrorString();
            const string message = "could not seek in BAM file: \n\t" + readerError;
            throw BamException("BamToolsIndex::GetOffset", message);
        }

        // load first available alignment, setting flag to true if data exists
        *hasAlignmentsInRegion = m_reader->LoadNextAlignment(al);

        // check alignment against region
        if ( al.GetEndPosition() <= region.LeftPosition ) {
            offsetFirst = ++offsetIter;
            count -= step+1;
        } else count = step;
    }

    // step back to the offset before the 'current offset' (to make sure we cover overlaps)
    if ( offsetIter != offsets.begin() )
        --offsetIter;
    offset = (*offsetIter);
}